

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_stream.cpp
# Opt level: O0

void __thiscall
libtorrent::http_stream::name_lookup(http_stream *this,error_code *e,iterator *i,handler_type *h)

{
  bool bVar1;
  basic_resolver_entry<boost::asio::ip::tcp> *this_00;
  http_stream *local_98;
  code *local_90;
  undefined8 local_88;
  type local_80;
  endpoint_type local_44;
  handler_type *local_28;
  handler_type *h_local;
  iterator *i_local;
  error_code *e_local;
  http_stream *this_local;
  
  local_28 = h;
  h_local = (handler_type *)i;
  i_local = (iterator *)e;
  e_local = (error_code *)this;
  bVar1 = proxy_base::handle_error(&this->super_proxy_base,e,h);
  if (!bVar1) {
    this_00 = boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::operator->(i);
    boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>::endpoint(&local_44,this_00);
    local_90 = connected;
    local_88 = 0;
    local_98 = this;
    std::
    bind<void(libtorrent::http_stream::*)(boost::system::error_code_const&,std::function<void(boost::system::error_code_const&)>&),libtorrent::http_stream*,std::_Placeholder<1>const&,std::function<void(boost::system::error_code_const&)>>
              (&local_80,(offset_in_http_stream_to_subr *)&local_90,&local_98,
               (_Placeholder<1> *)&std::placeholders::_1,local_28);
    boost::asio::
    basic_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
    ::
    async_connect<std::_Bind<void(libtorrent::http_stream::*(libtorrent::http_stream*,std::_Placeholder<1>,std::function<void(boost::system::error_code_const&)>))(boost::system::error_code_const&,std::function<void(boost::system::error_code_const&)>&)>>
              ((basic_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                *)this,&local_44,&local_80);
    std::
    _Bind<void_(libtorrent::http_stream::*(libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>))(const_boost::system::error_code_&,_std::function<void_(const_boost::system::error_code_&)>_&)>
    ::~_Bind(&local_80);
  }
  return;
}

Assistant:

void http_stream::name_lookup(error_code const& e, tcp::resolver::iterator i
		, handler_type& h)
	{
		if (handle_error(e, h)) return;

		m_sock.async_connect(i->endpoint(), std::bind(
			&http_stream::connected, this, _1, std::move(h)));
	}